

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertARGBToRGBA64PM_sse4<true>(QRgba64 *buffer,uint *src,int count)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  undefined8 *puVar12;
  QRgba64 QVar13;
  int in_EDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint s;
  int _i;
  __m128i dst2;
  __m128i dst1;
  __m128i alpha2;
  __m128i alpha1;
  __m128i src2;
  __m128i src1;
  bool cf;
  __m128i srcVector;
  __m128i zero;
  __m128i shuffleMask;
  __m128i rgbaMask;
  __m128i alphaMask;
  int i;
  uint rgb;
  int local_40c;
  undefined1 local_408 [16];
  undefined8 local_3f8;
  QRgba64 *this;
  int local_348;
  undefined1 local_298;
  undefined1 uStack_297;
  undefined1 uStack_296;
  undefined1 uStack_295;
  undefined1 uStack_294;
  undefined1 uStack_293;
  undefined1 uStack_292;
  undefined1 uStack_291;
  undefined1 uStack_270;
  undefined1 uStack_26f;
  undefined1 uStack_26e;
  undefined1 uStack_26d;
  undefined1 uStack_26c;
  undefined1 uStack_26b;
  undefined1 uStack_26a;
  undefined1 uStack_269;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rgb = 0x60f020f;
  for (local_348 = 0; local_348 < in_EDX + -3; local_348 = local_348 + 4) {
    pauVar11 = (undefined1 (*) [16])(CONCAT71(in_register_00000031,in_SIL) + (long)local_348 * 4);
    uVar2 = *(undefined8 *)*pauVar11;
    uVar3 = *(undefined8 *)(*pauVar11 + 8);
    auVar14._8_8_ = 0xff000000ff000000;
    auVar14._0_8_ = 0xff000000ff000000;
    if ((auVar14 & *pauVar11) == (undefined1  [16])0x0) {
      puVar12 = (undefined8 *)(in_RDI + (long)local_348 * 8);
      *puVar12 = 0;
      puVar12[1] = 0;
      puVar12 = (undefined8 *)(in_RDI + (long)(local_348 + 2) * 8);
      *puVar12 = 0;
      puVar12[1] = 0;
    }
    else {
      auVar15._8_8_ = 0xff000000ff000000;
      auVar15._0_8_ = 0xff000000ff000000;
      local_298 = (undefined1)uVar2;
      uStack_297 = (undefined1)((ulong)uVar2 >> 8);
      uStack_296 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_295 = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_294 = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_293 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_292 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_291 = (undefined1)((ulong)uVar2 >> 0x38);
      uStack_270 = (undefined1)uVar3;
      uStack_26f = (undefined1)((ulong)uVar3 >> 8);
      uStack_26e = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_26d = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_26c = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_26b = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_26a = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_269 = (undefined1)((ulong)uVar3 >> 0x38);
      if ((auVar15 & ~*pauVar11) == (undefined1  [16])0x0) {
        puVar12 = (undefined8 *)(in_RDI + (long)local_348 * 8);
        *puVar12 = CONCAT17(uStack_295,
                            CONCAT16(uStack_295,
                                     CONCAT15(uStack_296,
                                              CONCAT14(uStack_296,
                                                       CONCAT13(uStack_297,
                                                                CONCAT12(uStack_297,
                                                                         CONCAT11(local_298,
                                                                                  local_298)))))));
        puVar12[1] = CONCAT17(uStack_291,
                              CONCAT16(uStack_291,
                                       CONCAT15(uStack_292,
                                                CONCAT14(uStack_292,
                                                         CONCAT13(uStack_293,
                                                                  CONCAT12(uStack_293,
                                                                           CONCAT11(uStack_294,
                                                                                    uStack_294))))))
                             );
        puVar12 = (undefined8 *)(in_RDI + (long)(local_348 + 2) * 8);
        *puVar12 = CONCAT17(uStack_26d,
                            CONCAT16(uStack_26d,
                                     CONCAT15(uStack_26e,
                                              CONCAT14(uStack_26e,
                                                       CONCAT13(uStack_26f,
                                                                CONCAT12(uStack_26f,
                                                                         CONCAT11(uStack_270,
                                                                                  uStack_270)))))));
        puVar12[1] = CONCAT17(uStack_269,
                              CONCAT16(uStack_269,
                                       CONCAT15(uStack_26a,
                                                CONCAT14(uStack_26a,
                                                         CONCAT13(uStack_26b,
                                                                  CONCAT12(uStack_26b,
                                                                           CONCAT11(uStack_26c,
                                                                                    uStack_26c))))))
                             );
      }
      else {
        auVar8[1] = local_298;
        auVar8[0] = local_298;
        auVar8[2] = uStack_297;
        auVar8[3] = uStack_297;
        auVar8[4] = uStack_296;
        auVar8[5] = uStack_296;
        auVar8[6] = uStack_295;
        auVar8[7] = uStack_295;
        auVar8[9] = uStack_294;
        auVar8[8] = uStack_294;
        auVar8[10] = uStack_293;
        auVar8[0xb] = uStack_293;
        auVar8[0xc] = uStack_292;
        auVar8[0xd] = uStack_292;
        auVar8[0xe] = uStack_291;
        auVar8[0xf] = uStack_291;
        auVar7._8_8_ = 0xf0e0f0e0f0e0f0e;
        auVar7._0_8_ = 0x706070607060706;
        auVar14 = pshufb(auVar8,auVar7);
        auVar6[1] = uStack_270;
        auVar6[0] = uStack_270;
        auVar6[2] = uStack_26f;
        auVar6[3] = uStack_26f;
        auVar6[4] = uStack_26e;
        auVar6[5] = uStack_26e;
        auVar6[6] = uStack_26d;
        auVar6[7] = uStack_26d;
        auVar6[9] = uStack_26c;
        auVar6[8] = uStack_26c;
        auVar6[10] = uStack_26b;
        auVar6[0xb] = uStack_26b;
        auVar6[0xc] = uStack_26a;
        auVar6[0xd] = uStack_26a;
        auVar6[0xe] = uStack_269;
        auVar6[0xf] = uStack_269;
        auVar5._8_8_ = 0xf0e0f0e0f0e0f0e;
        auVar5._0_8_ = 0x706070607060706;
        auVar15 = pshufb(auVar6,auVar5);
        auVar10[1] = local_298;
        auVar10[0] = local_298;
        auVar10[2] = uStack_297;
        auVar10[3] = uStack_297;
        auVar10[4] = uStack_296;
        auVar10[5] = uStack_296;
        auVar10[6] = uStack_295;
        auVar10[7] = uStack_295;
        auVar10[9] = uStack_294;
        auVar10[8] = uStack_294;
        auVar10[10] = uStack_293;
        auVar10[0xb] = uStack_293;
        auVar10[0xc] = uStack_292;
        auVar10[0xd] = uStack_292;
        auVar10[0xe] = uStack_291;
        auVar10[0xf] = uStack_291;
        auVar16 = pmulhuw(auVar10,auVar14);
        auVar9[1] = uStack_270;
        auVar9[0] = uStack_270;
        auVar9[2] = uStack_26f;
        auVar9[3] = uStack_26f;
        auVar9[4] = uStack_26e;
        auVar9[5] = uStack_26e;
        auVar9[6] = uStack_26d;
        auVar9[7] = uStack_26d;
        auVar9[9] = uStack_26c;
        auVar9[8] = uStack_26c;
        auVar9[10] = uStack_26b;
        auVar9[0xb] = uStack_26b;
        auVar9[0xc] = uStack_26a;
        auVar9[0xd] = uStack_26a;
        auVar9[0xe] = uStack_269;
        auVar9[0xf] = uStack_269;
        auVar14 = pmulhuw(auVar9,auVar15);
        local_1b8 = auVar16._0_2_;
        sStack_1b6 = auVar16._2_2_;
        sStack_1b4 = auVar16._4_2_;
        sStack_1b2 = auVar16._6_2_;
        sStack_1b0 = auVar16._8_2_;
        sStack_1ae = auVar16._10_2_;
        sStack_1ac = auVar16._12_2_;
        sStack_1aa = auVar16._14_2_;
        local_3f8._2_2_ = sStack_1b6 - (sStack_1b6 >> 0xf);
        local_3f8._0_2_ = local_1b8 - (local_1b8 >> 0xf);
        local_3f8._4_2_ = sStack_1b4 - (sStack_1b4 >> 0xf);
        local_3f8._6_2_ = sStack_1b2 - (sStack_1b2 >> 0xf);
        stack0xfffffffffffffc10 = sStack_1b0 - (sStack_1b0 >> 0xf);
        stack0xfffffffffffffc12 = sStack_1ae - (sStack_1ae >> 0xf);
        stack0xfffffffffffffc14 = sStack_1ac - (sStack_1ac >> 0xf);
        stack0xfffffffffffffc16 = sStack_1aa - (sStack_1aa >> 0xf);
        local_1d8 = auVar14._0_2_;
        sStack_1d6 = auVar14._2_2_;
        sStack_1d4 = auVar14._4_2_;
        sStack_1d2 = auVar14._6_2_;
        sStack_1d0 = auVar14._8_2_;
        sStack_1ce = auVar14._10_2_;
        sStack_1cc = auVar14._12_2_;
        sStack_1ca = auVar14._14_2_;
        local_408._2_2_ = sStack_1d6 - (sStack_1d6 >> 0xf);
        local_408._0_2_ = local_1d8 - (local_1d8 >> 0xf);
        local_408._4_2_ = sStack_1d4 - (sStack_1d4 >> 0xf);
        local_408._6_2_ = sStack_1d2 - (sStack_1d2 >> 0xf);
        local_408._8_2_ = sStack_1d0 - (sStack_1d0 >> 0xf);
        local_408._10_2_ = sStack_1ce - (sStack_1ce >> 0xf);
        local_408._12_2_ = sStack_1cc - (sStack_1cc >> 0xf);
        local_408._14_2_ = sStack_1ca - (sStack_1ca >> 0xf);
        auVar4[1] = local_298;
        auVar4[0] = local_298;
        auVar4[2] = uStack_297;
        auVar4[3] = uStack_297;
        auVar4[4] = uStack_296;
        auVar4[5] = uStack_296;
        auVar4[6] = uStack_295;
        auVar4[7] = uStack_295;
        auVar4[8] = uStack_294;
        auVar4[9] = uStack_294;
        auVar4[10] = uStack_293;
        auVar4[0xb] = uStack_293;
        auVar4[0xc] = uStack_292;
        auVar4[0xd] = uStack_292;
        auVar4[0xe] = uStack_291;
        auVar4[0xf] = uStack_291;
        _local_3f8 = pblendw(_local_3f8,auVar4,0x88);
        auVar16[1] = uStack_270;
        auVar16[0] = uStack_270;
        auVar16[2] = uStack_26f;
        auVar16[3] = uStack_26f;
        auVar16[4] = uStack_26e;
        auVar16[5] = uStack_26e;
        auVar16[6] = uStack_26d;
        auVar16[7] = uStack_26d;
        auVar16[8] = uStack_26c;
        auVar16[9] = uStack_26c;
        auVar16[10] = uStack_26b;
        auVar16[0xb] = uStack_26b;
        auVar16[0xc] = uStack_26a;
        auVar16[0xd] = uStack_26a;
        auVar16[0xe] = uStack_269;
        auVar16[0xf] = uStack_269;
        auVar14 = pblendw(local_408,auVar16,0x88);
        puVar12 = (undefined8 *)(in_RDI + (long)local_348 * 8);
        *puVar12 = local_3f8;
        puVar12[1] = this;
        puVar12 = (undefined8 *)(in_RDI + (long)(local_348 + 2) * 8);
        local_408._0_8_ = auVar14._0_8_;
        local_408._8_8_ = auVar14._8_8_;
        *puVar12 = local_408._0_8_;
        puVar12[1] = local_408._8_8_;
      }
    }
  }
  for (local_40c = 0; local_40c < 3 && local_348 < in_EDX; local_40c = local_40c + 1) {
    RGBA2ARGB(*(quint32 *)(CONCAT71(in_register_00000031,in_SIL) + (long)local_348 * 4));
    QRgba64::fromArgb32(rgb);
    QVar13 = QRgba64::premultiplied(this);
    *(quint64 *)(in_RDI + (long)local_348 * 8) = QVar13.rgba;
    local_348 = local_348 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertARGBToRGBA64PM_sse4(QRgba64 *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            bool cf = _mm_testc_si128(srcVector, alphaMask);

            if (!RGBA)
                srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
            const __m128i src1 = _mm_unpacklo_epi8(srcVector, srcVector);
            const __m128i src2 = _mm_unpackhi_epi8(srcVector, srcVector);
            if (!cf) {
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                __m128i dst1 = _mm_mulhi_epu16(src1, alpha1);
                __m128i dst2 = _mm_mulhi_epu16(src2, alpha2);
                // Map 0->0xfffe to 0->0xffff
                dst1 = _mm_add_epi16(dst1, _mm_srli_epi16(dst1, 15));
                dst2 = _mm_add_epi16(dst2, _mm_srli_epi16(dst2, 15));
                // correct alpha value:
                dst1 = _mm_blend_epi16(dst1, src1, 0x88);
                dst2 = _mm_blend_epi16(dst2, src2, 0x88);
                _mm_storeu_si128((__m128i *)&buffer[i], dst1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], dst2);
            } else {
                _mm_storeu_si128((__m128i *)&buffer[i], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src2);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        const uint s = RGBA ? RGBA2ARGB(src[i]) : src[i];
        buffer[i] = QRgba64::fromArgb32(s).premultiplied();
    }
}